

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

_Bool spell_okay_list(player *p,_func__Bool_player_ptr_wchar_t *spell_test,int *spells,
                     wchar_t n_spells)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)n_spells;
  if (n_spells < L'\x01') {
    uVar2 = uVar3;
  }
  _Var4 = false;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    _Var1 = (*spell_test)(p,spells[uVar3]);
    _Var4 = (_Bool)(_Var4 | _Var1);
  }
  return _Var4;
}

Assistant:

bool spell_okay_list(const struct player *p,
		bool (*spell_test)(const struct player *p, int spell),
		const int spells[], int n_spells)
{
	int i;
	bool okay = false;

	for (i = 0; i < n_spells; i++)
		if (spell_test(p, spells[i]))
			okay = true;

	return okay;
}